

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_message<wchar_t> *
booster::locale::pgettext<wchar_t>(wchar_t *context,wchar_t *id,locale *loc)

{
  basic_message<wchar_t> *in_RDI;
  basic_message<wchar_t> *this;
  basic_message<wchar_t> *this_00;
  basic_message<wchar_t> *in_stack_ffffffffffffff50;
  basic_message<wchar_t> local_a0;
  
  this_00 = &local_a0;
  this = in_RDI;
  basic_message<wchar_t>::basic_message(in_stack_ffffffffffffff50,&this_00->n_,&in_RDI->n_);
  basic_message<wchar_t>::str_abi_cxx11_(this_00,(locale *)this);
  basic_message<wchar_t>::~basic_message(this);
  return in_RDI;
}

Assistant:

std::basic_string<CharType>  pgettext(  CharType const *context,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(context,id).str(loc);
        }